

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O0

void __thiscall
skiwi::environment<skiwi::environment_entry>::push_outer
          (environment<skiwi::environment_entry> *this,string *name,environment_entry e)

{
  bool bVar1;
  element_type *peVar2;
  mapped_type *pmVar3;
  undefined1 local_28 [8];
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> p_outer_copy;
  string *name_local;
  environment<skiwi::environment_entry> *this_local;
  
  p_outer_copy.
  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->p_outer);
  if (bVar1) {
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr
              ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)local_28,&this->p_outer)
    ;
    while( true ) {
      peVar2 = std::
               __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->p_outer);
      if (!bVar1) break;
      peVar2 = std::
               __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::operator=
                ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)local_28,
                 &peVar2->p_outer);
    }
    peVar2 = std::
             __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
             ::operator[](&peVar2->env,
                          (key_type *)
                          p_outer_copy.
                          super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
    pmVar3->st = e.st;
    *(undefined4 *)&pmVar3->field_0x4 = e._4_4_;
    pmVar3->pos = e.pos;
    (pmVar3->live_range).first = e.live_range.first;
    (pmVar3->live_range).last = e.live_range.last;
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr
              ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)local_28);
  }
  else {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
             ::operator[](&this->env,
                          (key_type *)
                          p_outer_copy.
                          super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
    pmVar3->st = e.st;
    *(undefined4 *)&pmVar3->field_0x4 = e._4_4_;
    pmVar3->pos = e.pos;
    (pmVar3->live_range).first = e.live_range.first;
    (pmVar3->live_range).last = e.live_range.last;
  }
  return;
}

Assistant:

void push_outer(const std::string& name, TEntry e)
      {
      /*
      if (p_outer)
        p_outer->push_outer(name, e);
      else
        env[name] = e;
      */
      if (p_outer)
        {
        auto p_outer_copy = p_outer;
        while (p_outer_copy->p_outer)
          p_outer_copy = p_outer_copy->p_outer;
        p_outer_copy->env[name] = e;
        }
      else
        env[name] = e;
      }